

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  time_t tVar2;
  int *piVar3;
  bool END_GAME;
  bool player2;
  bool player1;
  bool bots;
  Direction direction_2;
  Direction direction_1;
  vector<Snake_*,_std::allocator<Snake_*>_> snakes;
  thread thread_for_read_input;
  vector<Food_*,_std::allocator<Food_*>_> foods;
  Food f1;
  Food f2;
  Page page;
  Food f3;
  Snake B1;
  Snake S2;
  Snake S1;
  Snake B3;
  Snake B2;
  bool local_564;
  bool local_563;
  bool local_562;
  bool local_561;
  Direction local_560 [2];
  vector<Snake_*,_std::allocator<Snake_*>_> local_558;
  thread local_540;
  vector<Food_*,_std::allocator<Food_*>_> local_538;
  Snake *local_520;
  undefined4 local_518;
  undefined1 local_514;
  Point *local_510 [2];
  Point local_500 [2];
  Snake *local_4f0;
  undefined4 local_4e8;
  undefined1 local_4e4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4e0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0;
  long *local_4c0;
  long local_4b8;
  long local_4b0 [2];
  long *local_4a0;
  long local_498;
  long local_490 [2];
  long *local_480;
  long local_478;
  long local_470 [2];
  timespec local_460;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  Page local_310;
  undefined1 local_2a0 [16];
  Point *local_290;
  Point local_280 [2];
  reference_wrapper<bool> local_270;
  undefined1 local_268 [8];
  Snake local_260;
  Snake local_1f0;
  Snake local_180;
  Snake local_110;
  Snake local_a0;
  
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  local_564 = false;
  local_560[1] = 0;
  local_560[0] = LEFT;
  local_561 = false;
  local_562 = false;
  local_563 = false;
  local_558.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_558.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_558.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_538.super__Vector_base<Food_*,_std::allocator<Food_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_538.super__Vector_base<Food_*,_std::allocator<Food_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_538.super__Vector_base<Food_*,_std::allocator<Food_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"BOT 1","");
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"\x1b[35m","");
  Snake::Snake((Snake *)(local_268 + 8),(Point)0x300000016,5,&local_330,'o',&local_350,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"BOT 2","");
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"\x1b[36m","");
  Snake::Snake(&local_a0,(Point)0x30000000d,5,&local_370,'o',&local_390,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
  }
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"BOT 3","");
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"\x1b[32m","");
  Snake::Snake(&local_110,(Point)0x1000000003,5,&local_3b0,'o',&local_3d0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"PLAYER 1","");
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"\x1b[34m","");
  Snake::Snake(&local_180,(Point)0x300000003,5,&local_3f0,'o',&local_410,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"PLAYER 2","");
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"\x1b[31m","");
  Snake::Snake(&local_1f0,(Point)0x1000000016,5,&local_430,'o',&local_450,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  local_480 = local_470;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"\x1b[1m\x1b[33m","");
  local_520 = (Snake *)0xa0000000f;
  local_518 = 1;
  local_514 = 0x31;
  local_510[0] = local_500;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_510,local_480,local_478 + (long)local_480);
  if (local_480 != local_470) {
    operator_delete(local_480,local_470[0] + 1);
  }
  local_4a0 = local_490;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a0,"\x1b[1m\x1b[33m","");
  local_4f0 = (Snake *)0xa0000000a;
  local_4e8 = 3;
  local_4e4 = 0x33;
  local_4e0[0] = &local_4d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_4e0,local_4a0,local_498 + (long)local_4a0);
  if (local_4a0 != local_490) {
    operator_delete(local_4a0,local_490[0] + 1);
  }
  local_4c0 = local_4b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"\x1b[1m\x1b[33m","");
  local_2a0._0_8_ = (pointer)0xa00000014;
  local_2a0._8_4_ = 5;
  local_2a0[0xc] = 0x35;
  local_290 = local_280;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_290,local_4c0,local_4b8 + (long)local_4c0);
  if (local_4c0 != local_4b0) {
    operator_delete(local_4c0,local_4b0[0] + 1);
  }
  local_310.snakes.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
  super__Vector_impl_data._M_start = &local_520;
  std::vector<Food*,std::allocator<Food*>>::emplace_back<Food*>
            ((vector<Food*,std::allocator<Food*>> *)&local_538,(Food **)&local_310);
  local_310.snakes.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
  super__Vector_impl_data._M_start = &local_4f0;
  std::vector<Food*,std::allocator<Food*>>::emplace_back<Food*>
            ((vector<Food*,std::allocator<Food*>> *)&local_538,(Food **)&local_310);
  local_310.snakes.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_2a0;
  std::vector<Food*,std::allocator<Food*>>::emplace_back<Food*>
            ((vector<Food*,std::allocator<Food*>> *)&local_538,(Food **)&local_310);
  menu(&local_561,&local_562,&local_563);
  if (local_561 == true) {
    local_310.snakes.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)(local_268 + 8);
    std::vector<Snake*,std::allocator<Snake*>>::emplace_back<Snake*>
              ((vector<Snake*,std::allocator<Snake*>> *)&local_558,(Snake **)&local_310);
    local_310.snakes.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&local_a0;
    std::vector<Snake*,std::allocator<Snake*>>::emplace_back<Snake*>
              ((vector<Snake*,std::allocator<Snake*>> *)&local_558,(Snake **)&local_310);
    local_310.snakes.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&local_110;
    std::vector<Snake*,std::allocator<Snake*>>::emplace_back<Snake*>
              ((vector<Snake*,std::allocator<Snake*>> *)&local_558,(Snake **)&local_310);
  }
  if (local_562 == true) {
    local_310.snakes.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&local_180;
    std::vector<Snake*,std::allocator<Snake*>>::emplace_back<Snake*>
              ((vector<Snake*,std::allocator<Snake*>> *)&local_558,(Snake **)&local_310);
  }
  if (local_563 == true) {
    local_310.snakes.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&local_1f0;
    std::vector<Snake*,std::allocator<Snake*>>::emplace_back<Snake*>
              ((vector<Snake*,std::allocator<Snake*>> *)&local_558,(Snake **)&local_310);
  }
  Page::Page(&local_310,&local_558,&local_538);
  Page::print(&local_310);
  local_460.tv_sec = (__time_t)(local_560 + 1);
  local_268 = (undefined1  [8])local_560;
  local_270._M_data = &local_564;
  std::thread::
  thread<void(&)(Direction&,Direction&,bool&),std::reference_wrapper<Direction>,std::reference_wrapper<Direction>,std::reference_wrapper<bool>,void>
            (&local_540,read_input,(reference_wrapper<Direction> *)&local_460,
             (reference_wrapper<Direction> *)local_268,&local_270);
  do {
    if (local_564 != false) {
      std::thread::join();
      if (local_540._M_id._M_thread == 0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310.message._M_dataplus._M_p != &local_310.message.field_2) {
          operator_delete(local_310.message._M_dataplus._M_p,
                          local_310.message.field_2._M_allocated_capacity + 1);
        }
        if (local_310.foods.super__Vector_base<Food_*,_std::allocator<Food_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_310.foods.super__Vector_base<Food_*,_std::allocator<Food_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_310.foods.super__Vector_base<Food_*,_std::allocator<Food_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_310.foods.super__Vector_base<Food_*,_std::allocator<Food_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((Snake *)local_310.snakes.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
                     super__Vector_impl_data._M_start != (Snake *)0x0) {
          operator_delete(local_310.snakes.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_310.snakes.
                                super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_310.snakes.
                                super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_290 != local_280) {
          operator_delete(local_290,(long)local_280[0] + 1);
        }
        if (local_4e0[0] != &local_4d0) {
          operator_delete(local_4e0[0],local_4d0._M_allocated_capacity + 1);
        }
        if (local_510[0] != local_500) {
          operator_delete(local_510[0],(long)local_500[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0.color._M_dataplus._M_p != &local_1f0.color.field_2) {
          operator_delete(local_1f0.color._M_dataplus._M_p,
                          local_1f0.color.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0.name._M_dataplus._M_p != &local_1f0.name.field_2) {
          operator_delete(local_1f0.name._M_dataplus._M_p,
                          local_1f0.name.field_2._M_allocated_capacity + 1);
        }
        if (local_1f0.coordinates.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f0.coordinates.super__Vector_base<Point,_std::allocator<Point>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f0.coordinates.
                                super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f0.coordinates.
                                super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180.color._M_dataplus._M_p != &local_180.color.field_2) {
          operator_delete(local_180.color._M_dataplus._M_p,
                          local_180.color.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180.name._M_dataplus._M_p != &local_180.name.field_2) {
          operator_delete(local_180.name._M_dataplus._M_p,
                          local_180.name.field_2._M_allocated_capacity + 1);
        }
        if (local_180.coordinates.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_180.coordinates.super__Vector_base<Point,_std::allocator<Point>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_180.coordinates.
                                super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_180.coordinates.
                                super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110.color._M_dataplus._M_p != &local_110.color.field_2) {
          operator_delete(local_110.color._M_dataplus._M_p,
                          local_110.color.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110.name._M_dataplus._M_p != &local_110.name.field_2) {
          operator_delete(local_110.name._M_dataplus._M_p,
                          local_110.name.field_2._M_allocated_capacity + 1);
        }
        if (local_110.coordinates.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_110.coordinates.super__Vector_base<Point,_std::allocator<Point>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_110.coordinates.
                                super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_110.coordinates.
                                super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0.color._M_dataplus._M_p != &local_a0.color.field_2) {
          operator_delete(local_a0.color._M_dataplus._M_p,
                          local_a0.color.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0.name._M_dataplus._M_p != &local_a0.name.field_2) {
          operator_delete(local_a0.name._M_dataplus._M_p,
                          local_a0.name.field_2._M_allocated_capacity + 1);
        }
        if (local_a0.coordinates.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a0.coordinates.super__Vector_base<Point,_std::allocator<Point>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_a0.coordinates.
                                super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_a0.coordinates.
                                super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260.color._M_dataplus._M_p != &local_260.color.field_2) {
          operator_delete(local_260.color._M_dataplus._M_p,
                          local_260.color.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260.name._M_dataplus._M_p != &local_260.name.field_2) {
          operator_delete(local_260.name._M_dataplus._M_p,
                          local_260.name.field_2._M_allocated_capacity + 1);
        }
        if (local_260.coordinates.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_260.coordinates.super__Vector_base<Point,_std::allocator<Point>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_260.coordinates.
                                super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_260.coordinates.
                                super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_538.super__Vector_base<Food_*,_std::allocator<Food_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_538.super__Vector_base<Food_*,_std::allocator<Food_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_538.super__Vector_base<Food_*,_std::allocator<Food_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_538.super__Vector_base<Food_*,_std::allocator<Food_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_558.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_558.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_558.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_558.super__Vector_base<Snake_*,_std::allocator<Snake_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        return 0;
      }
      std::terminate();
    }
    local_460.tv_sec = 0;
    local_460.tv_nsec = 300000000;
    do {
      iVar1 = nanosleep(&local_460,&local_460);
      if (iVar1 != -1) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    Page::move_once(&local_310,local_560 + 1,local_560,&local_564);
    Page::print(&local_310);
  } while( true );
}

Assistant:

int main()
{
	srand(time(0));	

    // Setting
	bool END_GAME = false;
	Direction direction_1 = LEFT;
	Direction direction_2 = LEFT;
	int LEVEL = EASY;
	bool bots = false;
	bool player1 = false;
	bool player2 = false;

	vector<Snake*> snakes;
	vector<Food*> foods;

	Snake B1(Point(22, 3), 5, "BOT 1", 'o', MAGENTA, BOT);
	Snake B2(Point(13, 3), 5, "BOT 2", 'o', CYAN, BOT);
	Snake B3(Point(3, 16), 5, "BOT 3", 'o', GREEN, BOT);

	Snake S1(Point(3, 3), 5, "PLAYER 1", 'o', BLUE, NOT_BOT);
	Snake S2(Point(22, 16), 5, "PLAYER 2", 'o', RED, NOT_BOT);

	Food f1(Point(15, 10), 1, '1', BOLDYELLOW);
	Food f2(Point(10, 10), 3, '3', BOLDYELLOW);
	Food f3(Point(20, 10), 5, '5', BOLDYELLOW);

	foods.push_back(&f1);
	foods.push_back(&f2);
	foods.push_back(&f3);

	menu(bots, player1, player2);
	
	// BOTS	
	if(bots)
	{
		snakes.push_back(&B1);
		snakes.push_back(&B2);
		snakes.push_back(&B3);
	}

	// PLAYERS
	if(player1)
		snakes.push_back(&S1);

	if(player2)	
		snakes.push_back(&S2);

	
	// Page setting
	Page page(snakes, foods);
	page.print();
	
	thread thread_for_read_input(read_input, ref(direction_1), ref(direction_2), ref(END_GAME));

	while(!END_GAME)
	{
        this_thread::sleep_for(chrono::milliseconds(LEVEL));
		page.move_once(direction_1, direction_2, END_GAME);
		page.print();	
	}
	thread_for_read_input.join();

}